

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
                   *this)

{
  undefined1 *__ptr;
  
  SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
  ::destroy_range((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                   *)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                     .super_SmallVectorBase.BeginX,
                  (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                   *)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                     .super_SmallVectorBase.EndX);
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
          ).
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
          .super_SmallVectorBase.BeginX;
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }